

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<DataStream_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  byte bVar1;
  long lVar2;
  size_type sVar3;
  byte *in_RDX;
  long in_FS_OFFSET;
  size_t i;
  bool fAllowWitness;
  uchar flags;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ParamsStream<DataStream_&,_TransactionSerParams> *in_stack_ffffffffffffff58;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *in_RDX;
  ParamsStream<DataStream&,TransactionSerParams>::operator>>
            (in_stack_ffffffffffffff58,
             (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(in_stack_ffffffffffffff48);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::clear
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff48);
  ParamsStream<DataStream&,TransactionSerParams>::operator>>
            (in_stack_ffffffffffffff58,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size(in_stack_ffffffffffffff48);
  if ((sVar3 == 0) && ((bVar1 & 1) != 0)) {
    ParamsStream<DataStream&,TransactionSerParams>::operator>>
              (in_stack_ffffffffffffff58,
               (uchar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else {
    ParamsStream<DataStream&,TransactionSerParams>::operator>>
              (in_stack_ffffffffffffff58,
               (vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  ParamsStream<DataStream&,TransactionSerParams>::operator>>
            (in_stack_ffffffffffffff58,
             (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UnserializeTransaction(TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s >> tx.version;
    unsigned char flags = 0;
    tx.vin.clear();
    tx.vout.clear();
    /* Try to read the vin. In case the dummy is there, this will be read as an empty vector. */
    s >> tx.vin;
    if (tx.vin.size() == 0 && fAllowWitness) {
        /* We read a dummy or an empty vin. */
        s >> flags;
        if (flags != 0) {
            s >> tx.vin;
            s >> tx.vout;
        }
    } else {
        /* We read a non-empty vin. Assume a normal vout follows. */
        s >> tx.vout;
    }
    if ((flags & 1) && fAllowWitness) {
        /* The witness flag is present, and we support witnesses. */
        flags ^= 1;
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s >> tx.vin[i].scriptWitness.stack;
        }
        if (!tx.HasWitness()) {
            /* It's illegal to encode witnesses when all witness stacks are empty. */
            throw std::ios_base::failure("Superfluous witness record");
        }
    }
    if (flags) {
        /* Unknown flag in the serialization */
        throw std::ios_base::failure("Unknown transaction optional data");
    }
    s >> tx.nLockTime;
}